

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
AllocatorsAreEmpty(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                   *this)

{
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  FreeObject *pFVar2;
  SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *local_20;
  TBlockAllocatorType *current;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  local_20 = &this->allocatorHead;
  while ((pSVar1 = SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                   ::GetHeapBlock(local_20),
         pSVar1 == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0 &&
         (pFVar2 = SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                   ::GetExplicitFreeList(local_20), pFVar2 == (FreeObject *)0x0))) {
    local_20 = SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
               ::GetNext(local_20);
    if (local_20 == &this->allocatorHead) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
HeapBucketT<TBlockType>::AllocatorsAreEmpty() const
{
    TBlockAllocatorType const * current = &allocatorHead;
    do
    {
        if (current->GetHeapBlock() != nullptr || current->GetExplicitFreeList() != nullptr)
        {
            return false;
        }
        current = current->GetNext();
    }
    while (current != &allocatorHead);
    return true;
}